

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnReturnCallIndirectExpr
          (BinaryReaderInterp *this,Index sig_index,Index table_index)

{
  string_view *psVar1;
  State *pSVar2;
  pointer pFVar3;
  SharedValidator *this_00;
  Result RVar4;
  Index IVar5;
  Enum EVar6;
  uint keep;
  uint uVar7;
  int iVar8;
  Index catch_drop_count;
  Location loc;
  Location loc_2;
  Location loc_1;
  u32 local_1c4;
  SharedValidator *local_1c0;
  Location local_1b8;
  Location local_198;
  Location local_178;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  local_1c0 = &this->validator_;
  local_1b8.field_1.field_0.last_column = 0;
  local_1b8.filename._M_len = (this->filename_)._M_len;
  local_1b8.filename._M_str = (this->filename_)._M_str;
  pSVar2 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_1b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar2->offset;
  local_178.field_1.field_0.last_column = 0;
  local_178.filename._M_len = (this->filename_)._M_len;
  local_178.filename._M_str = (this->filename_)._M_str;
  local_178.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar2->offset;
  Var::Var(&local_78,sig_index,&local_178);
  this_00 = local_1c0;
  local_198.field_1.field_0.last_column = 0;
  local_198.filename._M_len = (this->filename_)._M_len;
  local_198.filename._M_str = (this->filename_)._M_str;
  local_198.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  Var::Var(&local_c0,table_index,&local_198);
  RVar4 = SharedValidator::OnReturnCallIndirect(this_00,&local_1b8,&local_78,&local_c0);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  EVar6 = Error;
  if (RVar4.enum_ != Error) {
    pFVar3 = (this->module_->func_types).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    keep = (int)((ulong)((long)*(pointer *)
                                ((long)&pFVar3[sig_index].params.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                + 8) -
                        *(long *)&pFVar3[sig_index].params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>) >> 3)
           + 1;
    uVar7 = (uint)((ulong)((long)(this->validator_).typechecker_.type_stack_.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)(this->validator_).typechecker_.type_stack_.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
    iVar8 = uVar7 - keep;
    if (uVar7 < keep) {
      iVar8 = 0;
    }
    IVar5 = SharedValidator::GetLocalCount(this_00);
    RVar4 = TypeChecker::GetCatchCount
                      (&(this->validator_).typechecker_,
                       (int)((ulong)((long)(this->label_stack_).
                                           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->label_stack_).
                                          super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                       &local_1c4);
    EVar6 = Error;
    if (RVar4.enum_ != Error) {
      psVar1 = &this->filename_;
      local_1b8.field_1.field_0.last_column = 0;
      local_1b8.filename._M_len = psVar1->_M_len;
      local_1b8.filename._M_str = (this->filename_)._M_str;
      pSVar2 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
      local_1b8.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar2->offset;
      local_178.field_1.field_0.last_column = 0;
      local_178.filename._M_len = psVar1->_M_len;
      local_178.filename._M_str = (this->filename_)._M_str;
      local_178.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar2->offset;
      Var::Var(&local_108,sig_index,&local_178);
      local_198.field_1.field_0.last_column = 0;
      local_198.filename._M_len = psVar1->_M_len;
      local_198.filename._M_str = (this->filename_)._M_str;
      local_198.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      Var::Var(&local_150,table_index,&local_198);
      RVar4 = SharedValidator::OnReturnCallIndirect(local_1c0,&local_1b8,&local_108,&local_150);
      Var::~Var(&local_150);
      Var::~Var(&local_108);
      if (RVar4.enum_ != Error) {
        Istream::EmitDropKeep(this->istream_,iVar8 + IVar5,keep);
        Istream::EmitCatchDrop(this->istream_,local_1c4);
        Istream::Emit(this->istream_,ReturnCallIndirect,table_index,sig_index);
        EVar6 = Ok;
      }
    }
  }
  return (Result)EVar6;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallIndirectExpr(Index sig_index,
                                                    Index table_index) {
  CHECK_RESULT(validator_.OnReturnCallIndirect(
      GetLocation(), Var(sig_index, GetLocation()),
      Var(table_index, GetLocation())));

  FuncType& func_type = module_.func_types[sig_index];

  Index drop_count, keep_count, catch_drop_count;
  // +1 to include the index of the function.
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, +1, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &catch_drop_count));
  // The validator must be run after we get the drop/keep counts, since it
  // changes the type stack.
  CHECK_RESULT(validator_.OnReturnCallIndirect(
      GetLocation(), Var(sig_index, GetLocation()),
      Var(table_index, GetLocation())));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);
  istream_.Emit(Opcode::ReturnCallIndirect, table_index, sig_index);
  return Result::Ok;
}